

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void Json::CharReaderBuilder::ecma404Mode(Value *settings)

{
  Value *pVVar1;
  Value VStack_38;
  
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowComments");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowTrailingCommas");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"strictRoot");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowDroppedNullPlaceholders");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowNumericKeys");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowSingleQuotes");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,1000);
  pVVar1 = Value::operator[](settings,"stackLimit");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,true);
  pVVar1 = Value::operator[](settings,"failIfExtra");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"rejectDupKeys");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"allowSpecialFloats");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  Value::Value(&VStack_38,false);
  pVVar1 = Value::operator[](settings,"skipBom");
  Value::operator=(pVVar1,&VStack_38);
  Value::~Value(&VStack_38);
  return;
}

Assistant:

void CharReaderBuilder::ecma404Mode(Json::Value* settings) {
  //! [CharReaderBuilderECMA404Mode]
  (*settings)["allowComments"] = false;
  (*settings)["allowTrailingCommas"] = false;
  (*settings)["strictRoot"] = false;
  (*settings)["allowDroppedNullPlaceholders"] = false;
  (*settings)["allowNumericKeys"] = false;
  (*settings)["allowSingleQuotes"] = false;
  (*settings)["stackLimit"] = 1000;
  (*settings)["failIfExtra"] = true;
  (*settings)["rejectDupKeys"] = false;
  (*settings)["allowSpecialFloats"] = false;
  (*settings)["skipBom"] = false;
  //! [CharReaderBuilderECMA404Mode]
}